

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestPlatformTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_UTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess_CallToWaitPidWhileDebuggingInSeparateProcessWorks_TestShell
::createTest(TEST_UTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess_CallToWaitPidWhileDebuggingInSeparateProcessWorks_TestShell
             *this)

{
  TEST_UTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess_CallToWaitPidWhileDebuggingInSeparateProcessWorks_Test
  *this_00;
  
  this_00 = (TEST_UTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess_CallToWaitPidWhileDebuggingInSeparateProcessWorks_Test
             *)operator_new(0x38,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/UtestPlatformTest.cpp"
                            ,0xa1);
  TEST_UTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess_CallToWaitPidWhileDebuggingInSeparateProcessWorks_Test
  ::
  TEST_UTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess_CallToWaitPidWhileDebuggingInSeparateProcessWorks_Test
            (this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(UTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess, CallToWaitPidWhileDebuggingInSeparateProcessWorks)
{
    UT_PTR_SET(original_waitpid, PlatformSpecificWaitPid);
    UT_PTR_SET(PlatformSpecificWaitPid, waitpid_while_debugging_stub);
    waitpid_while_debugging_stub_number_called = 0;
    waitpid_while_debugging_stub_forced_failures = 10;
    fixture.setRunTestsInSeperateProcess();
    fixture.runAllTests();
    fixture.assertPrintContains("OK (1 tests, 1 ran, 0 checks, 0 ignored, 0 filtered out");
    // extra check to confirm that waitpid() was polled until it passed (and passed call adds one)
    CHECK(waitpid_while_debugging_stub_number_called > waitpid_while_debugging_stub_forced_failures);
}